

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

char * aaffect_loc_name(int location)

{
  char *pcVar1;
  string_view fmt;
  int location_local;
  
  if ((uint)location < 4) {
    pcVar1 = &DAT_003de590 + *(int *)(&DAT_003de590 + (ulong)(uint)location * 4);
  }
  else {
    fmt._M_str = "aaffect_loc_name: unknown  location {}.";
    fmt._M_len = 0x27;
    CLogger::Warn<int&>((CLogger *)&RS.field_0x140,fmt,&location_local);
    pcVar1 = "(unknown)";
  }
  return pcVar1;
}

Assistant:

char *aaffect_loc_name(int location)
{
	switch (location)
	{
		case APPLY_AREA_NONE:
			return "none";
		case APPLY_AREA_SKY:
			return "sky";
		case APPLY_AREA_TEMP:
			return "temperature";
		case APPLY_AREA_WIND:
			return "wind";
	}

	RS.Logger.Warn("aaffect_loc_name: unknown  location {}.", location);
	return "(unknown)";
}